

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::setDesiredFullJointsConfiguration
          (InverseKinematics *this,Span<const_double,__1L> desiredJointConfiguration,
          Span<const_double,__1L> weights)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::setDesiredFullJointsConfiguration(iDynTree::Span<const double> desiredJointConfiguration,
                                                              iDynTree::Span<const double> weights)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        assert(IK_PIMPL(m_pimpl)->m_preferredJointsConfiguration.size() == desiredJointConfiguration.size());

        if (desiredJointConfiguration.size() != weights.size()){
            reportError("InverseKinematics", "setDesiredFullJointsConfiguration", "The dimension of the desired weights is different from the desiredJointConfiguration size.");
            return false;
        }

        IK_PIMPL(m_pimpl)->m_preferredJointsConfiguration = desiredJointConfiguration;

        assert(IK_PIMPL(m_pimpl)->m_preferredJointsWeight.size() == weights.size());
        for (unsigned int i = 0; i < weights.size(); ++i){
            if (weights[i] >= 0.0) {
                IK_PIMPL(m_pimpl)->m_preferredJointsWeight(i) = weights[i];
            }
        }
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }